

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_kernel_bmod.h
# Opt level: O2

void Eigen::internal::LU_kernel_bmod<-1>::
     run<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
               (int segsize,
               Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *dense,
               Matrix<double,__1,_1,_0,__1,_1> *tempv,Matrix<double,__1,_1,_0,__1,_1> *lusup,
               int *luptr,int lda,int nrow,Matrix<int,__1,_1,_0,__1,_1> *lsub,int lptr,int no_zeros)

{
  Scalar SVar1;
  Scalar SVar2;
  double dVar3;
  int iVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  long lVar8;
  ulong uVar9;
  Scalar *pSVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  undefined1 auStack_100 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> A;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> u;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_> l;
  undefined1 auStack_88 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> B;
  
  uVar13 = 0;
  uVar16 = 0;
  if (0 < segsize) {
    uVar16 = (ulong)(uint)segsize;
  }
  for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,
                        (long)(lptr + no_zeros) + uVar13);
    pSVar6 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)dense,(long)*pSVar5);
    SVar1 = *pSVar6;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)tempv,uVar13);
    *pSVar7 = SVar1;
  }
  lVar14 = (long)((lda + 1) * no_zeros) + (long)*luptr;
  *luptr = (int)lVar14;
  pdVar15 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  lVar8 = (long)segsize;
  OuterStride<-1>::OuterStride((OuterStride<_1> *)auStack_88,(long)lda);
  MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           *)auStack_100,pdVar15 + lVar14,lVar8,lVar8);
  A.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_cols.m_value = (long)auStack_88;
  MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::MapBase
            ((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              *)&A.m_stride.super_Stride<_1,_0>.field_0x8,
             (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,lVar8);
  u._16_8_ = auStack_88;
  auStack_88 = auStack_100;
  B.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = A.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data;
  B.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_rows = A.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows;
  B.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_cols = A.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols;
  l.super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>.
  m_data = (PointerType)A.m_stride.super_Stride<_1,_0>._8_8_;
  l.super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>.
  m_rows.m_value = u._0_8_;
  triangular_solve_retval<1,Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>
  ::evalTo<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((triangular_solve_retval<1,Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              *)&u.field_0x10,
             (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             &A.m_stride.super_Stride<_1,_0>.field_0x8);
  iVar4 = *luptr;
  *luptr = (int)(iVar4 + lVar8);
  pdVar15 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  OuterStride<-1>::OuterStride((OuterStride<_1> *)&u.field_0x10,(long)lda);
  MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           *)auStack_88,pdVar15 + iVar4 + lVar8,(long)nrow,lVar8);
  B.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_cols.m_value = u._16_8_;
  pdVar15 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
            + lVar8;
  uVar13 = 0;
  uVar12 = ((auStack_88._0_4_ << 0x1c) >> 0x1f) + 2;
  if (((ulong)auStack_88 & 7) != 0) {
    uVar12 = 0;
  }
  uVar11 = uVar12 - 2;
  if (uVar12 < 2) {
    uVar11 = uVar12;
  }
  uVar9 = (ulong)((uint)((ulong)pdVar15 >> 3) & 1);
  if (((ulong)pdVar15 & 7) != 0) {
    uVar9 = 2;
  }
  OuterStride<-1>::OuterStride
            ((OuterStride<_1> *)&l.m_stride.super_Stride<_1,_0>.field_0x8,
             (long)(((nrow + 1) / 2) * 2));
  MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>
           *)&u.field_0x10,pdVar15 + uVar9 + (long)(int)uVar11,(long)nrow);
  l.super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>.
  _16_8_ = l.m_stride.super_Stride<_1,_0>._8_8_;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>_>::
  setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>_>
           *)&u.field_0x10);
  sparselu_gemm<double,long>
            ((long)l.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data,1,
             B.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value,(double *)auStack_88,
             B.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value,(double *)A.m_stride.super_Stride<_1,_0>._8_8_,u._0_8_,
             (double *)u._16_8_,
             l.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>
             ._16_8_);
  lVar8 = (long)(lptr + no_zeros);
  for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,lVar8);
    iVar4 = *pSVar5;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)tempv,uVar13);
    SVar2 = *pSVar7;
    pSVar6 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)dense,(long)iVar4);
    *pSVar6 = SVar2;
    lVar8 = lVar8 + 1;
  }
  uVar16 = 0;
  uVar13 = (ulong)(uint)nrow;
  if (nrow < 1) {
    uVar13 = uVar16;
  }
  for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,
                        lVar8 + uVar16);
    iVar4 = *pSVar5;
    pSVar10 = DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)&u.field_0x10,uVar16);
    dVar3 = *pSVar10;
    pSVar6 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)dense,(long)iVar4);
    *pSVar6 = *pSVar6 - dVar3;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void LU_kernel_bmod<SegSizeAtCompileTime>::run(const int segsize, BlockScalarVector& dense, ScalarVector& tempv, ScalarVector& lusup, Index& luptr, const Index lda,
                                                                  const Index nrow, IndexVector& lsub, const Index lptr, const Index no_zeros)
{
  typedef typename ScalarVector::Scalar Scalar;
  // First, copy U[*,j] segment from dense(*) to tempv(*)
  // The result of triangular solve is in tempv[*]; 
    // The result of matric-vector update is in dense[*]
  Index isub = lptr + no_zeros; 
  int i;
  Index irow;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub); 
    tempv(i) = dense(irow); 
    ++isub; 
  }
  // Dense triangular solve -- start effective triangle
  luptr += lda * no_zeros + no_zeros; 
  // Form Eigen matrix and vector 
  Map<Matrix<Scalar,SegSizeAtCompileTime,SegSizeAtCompileTime>, 0, OuterStride<> > A( &(lusup.data()[luptr]), segsize, segsize, OuterStride<>(lda) );
  Map<Matrix<Scalar,SegSizeAtCompileTime,1> > u(tempv.data(), segsize);
  
  u = A.template triangularView<UnitLower>().solve(u); 
  
  // Dense matrix-vector product y <-- B*x 
  luptr += segsize;
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  Index ldl = internal::first_multiple(nrow, PacketSize);
  Map<Matrix<Scalar,Dynamic,SegSizeAtCompileTime>, 0, OuterStride<> > B( &(lusup.data()[luptr]), nrow, segsize, OuterStride<>(lda) );
  Index aligned_offset = internal::first_aligned(tempv.data()+segsize, PacketSize);
  Index aligned_with_B_offset = (PacketSize-internal::first_aligned(B.data(), PacketSize))%PacketSize;
  Map<Matrix<Scalar,Dynamic,1>, 0, OuterStride<> > l(tempv.data()+segsize+aligned_offset+aligned_with_B_offset, nrow, OuterStride<>(ldl) );
  
  l.setZero();
  internal::sparselu_gemm<Scalar>(l.rows(), l.cols(), B.cols(), B.data(), B.outerStride(), u.data(), u.outerStride(), l.data(), l.outerStride());
  
  // Scatter tempv[] into SPA dense[] as a temporary storage 
  isub = lptr + no_zeros;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub++); 
    dense(irow) = tempv(i);
  }
  
  // Scatter l into SPA dense[]
  for (i = 0; i < nrow; i++)
  {
    irow = lsub(isub++); 
    dense(irow) -= l(i);
  } 
}